

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_self_test(int verbose)

{
  undefined1 local_468 [8];
  mbedtls_x509_crt clicert;
  mbedtls_x509_crt cacert;
  uint32_t flags;
  int ret;
  int verbose_local;
  
  if (verbose != 0) {
    printf("  X.509 certificate load: ");
  }
  mbedtls_x509_crt_init((mbedtls_x509_crt *)local_468);
  cacert.next._4_4_ =
       mbedtls_x509_crt_parse((mbedtls_x509_crt *)local_468,(uchar *)mbedtls_test_cli_crt,0x4b9);
  if (cacert.next._4_4_ == 0) {
    mbedtls_x509_crt_init((mbedtls_x509_crt *)&clicert.next);
    cacert.next._4_4_ =
         mbedtls_x509_crt_parse
                   ((mbedtls_x509_crt *)&clicert.next,(uchar *)mbedtls_test_ca_crt,0x51b);
    if (cacert.next._4_4_ == 0) {
      if (verbose != 0) {
        printf("passed\n  X.509 signature verify: ");
      }
      cacert.next._4_4_ =
           mbedtls_x509_crt_verify
                     ((mbedtls_x509_crt *)local_468,(mbedtls_x509_crt *)&clicert.next,
                      (mbedtls_x509_crl *)0x0,(char *)0x0,(uint32_t *)&cacert.next,
                      (_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *)0x0,(void *)0x0);
      if (cacert.next._4_4_ == 0) {
        if (verbose != 0) {
          printf("passed\n\n");
        }
        mbedtls_x509_crt_free((mbedtls_x509_crt *)&clicert.next);
        mbedtls_x509_crt_free((mbedtls_x509_crt *)local_468);
        ret = 0;
      }
      else {
        if (verbose != 0) {
          printf("failed\n");
        }
        ret = cacert.next._4_4_;
      }
    }
    else {
      if (verbose != 0) {
        printf("failed\n");
      }
      ret = cacert.next._4_4_;
    }
  }
  else {
    if (verbose != 0) {
      printf("failed\n");
    }
    ret = cacert.next._4_4_;
  }
  return ret;
}

Assistant:

int mbedtls_x509_self_test( int verbose )
{
#if defined(MBEDTLS_CERTS_C) && defined(MBEDTLS_SHA1_C)
    int ret;
    uint32_t flags;
    mbedtls_x509_crt cacert;
    mbedtls_x509_crt clicert;

    if( verbose != 0 )
        mbedtls_printf( "  X.509 certificate load: " );

    mbedtls_x509_crt_init( &clicert );

    ret = mbedtls_x509_crt_parse( &clicert, (const unsigned char *) mbedtls_test_cli_crt,
                           mbedtls_test_cli_crt_len );
    if( ret != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        return( ret );
    }

    mbedtls_x509_crt_init( &cacert );

    ret = mbedtls_x509_crt_parse( &cacert, (const unsigned char *) mbedtls_test_ca_crt,
                          mbedtls_test_ca_crt_len );
    if( ret != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        return( ret );
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n  X.509 signature verify: ");

    ret = mbedtls_x509_crt_verify( &clicert, &cacert, NULL, NULL, &flags, NULL, NULL );
    if( ret != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        return( ret );
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n\n");

    mbedtls_x509_crt_free( &cacert  );
    mbedtls_x509_crt_free( &clicert );

    return( 0 );
#else
    ((void) verbose);
    return( 0 );
#endif /* MBEDTLS_CERTS_C && MBEDTLS_SHA1_C */
}